

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O0

bool __thiscall
Diligent::Serializer<(Diligent::SerializerMode)0>::Copy<unsigned_char>
          (Serializer<(Diligent::SerializerMode)0> *this,uchar *pData,size_t Size)

{
  bool bVar1;
  Char *Message;
  char (*in_R8) [7];
  undefined1 local_48 [8];
  string msg;
  size_t Size_local;
  uchar *pData_local;
  Serializer<(Diligent::SerializerMode)0> *this_local;
  
  bVar1 = this->m_Ptr + Size <= this->m_End;
  msg.field_2._8_8_ = Size;
  if (bVar1) {
    memcpy(pData,this->m_Ptr,Size);
    this->m_Ptr = this->m_Ptr + msg.field_2._8_8_;
  }
  else {
    FormatString<char[26],unsigned_long,char[7]>
              ((string *)local_48,(Diligent *)"Note enough data to read ",
               (char (*) [26])((long)&msg.field_2 + 8),(unsigned_long *)0xcc224d,in_R8);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"Copy",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Serializer.hpp"
               ,0x149);
    std::__cxx11::string::~string((string *)local_48);
  }
  return bVar1;
}

Assistant:

bool Serializer<SerializerMode::Read>::Copy(T* pData, size_t Size)
{
    static_assert(IsAlignedBaseClass<T>::Value, "There is unused space at the end of the structure that may be filled with garbage. Use padding to zero-initialize this space and avoid nasty issues.");
    CHECK_REMAINING_SIZE(Size, "Note enough data to read ", Size, " bytes");
    std::memcpy(pData, m_Ptr, Size);
    m_Ptr += Size;
    return true;
}